

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

void qStreamNtlmString(QDataStream *ds,QString *s,bool unicode)

{
  const_iterator pQVar1;
  const_iterator pQVar2;
  byte in_DL;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  const_iterator __end1;
  const_iterator __begin1;
  QString *__range1;
  QChar ch;
  QString *in_stack_ffffffffffffff98;
  quint16 i;
  QDataStream *in_stack_ffffffffffffffa0;
  QByteArray *in_stack_ffffffffffffffa8;
  QDataStream *in_stack_ffffffffffffffb0;
  QChar local_22 [13];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    QString::toLatin1(in_stack_ffffffffffffff98);
    qStreamNtlmBuffer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    QByteArray::~QByteArray((QByteArray *)0x209b4d);
  }
  else {
    pQVar1 = QString::begin((QString *)0x209b75);
    pQVar2 = QString::end((QString *)in_stack_ffffffffffffffa0);
    for (; pQVar1 != pQVar2; pQVar1 = pQVar1 + 1) {
      local_22[0].ucs = pQVar1->ucs;
      i = (quint16)((ulong)in_RDI >> 0x30);
      QChar::unicode(local_22);
      QDataStream::operator<<(in_stack_ffffffffffffffa0,i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qStreamNtlmString(QDataStream& ds, const QString& s, bool unicode)
{
    if (!unicode) {
        qStreamNtlmBuffer(ds, s.toLatin1());
        return;
    }

    for (QChar ch : s)
        ds << quint16(ch.unicode());
}